

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reverse_suite.cpp
# Opt level: O0

void reverse_null(void)

{
  type v;
  nullable local_7c;
  iterator local_78;
  iterator local_50;
  undefined1 local_38 [8];
  variable data;
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)local_38);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_50,(basic_variable<std::allocator<char>_> *)local_38);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_78,(basic_variable<std::allocator<char>_> *)local_38);
  std::reverse<trial::dynamic::basic_variable<std::allocator<char>>::iterator>(&local_50,&local_78);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_78);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_50);
  local_7c = null;
  v = trial::dynamic::operator==((basic_variable<std::allocator<char>_> *)local_38,&local_7c);
  boost::detail::test_impl
            ("data == null",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/reverse_suite.cpp"
             ,0x19,"void reverse_null()",v);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_38);
  return;
}

Assistant:

void reverse_null()
{
    variable data;
    std::reverse(data.begin(), data.end());
    TRIAL_PROTOCOL_TEST(data == null);
}